

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O3

void TPZFrontNonSym<std::complex<float>_>::main(void)

{
  undefined8 uVar1;
  int iVar2;
  complex<float> *__s;
  int64_t i;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  string OutFile;
  TPZVec<long> DestIndex;
  TPZFMatrix<std::complex<float>_> TestMatrix;
  TPZFMatrix<std::complex<float>_> Prova;
  TPZFrontNonSym<std::complex<float>_> TestFront;
  ofstream outeqn;
  ofstream output;
  TPZEqnArray<std::complex<float>_> Result;
  char *local_3a68;
  undefined8 local_3a60;
  char local_3a58;
  undefined7 uStack_3a57;
  TPZVec<long> local_3a48;
  TPZFMatrix<std::complex<float>_> local_3a28;
  TPZFMatrix<std::complex<float>_> local_3998;
  TPZFMatrix<std::complex<float>_> local_3908;
  TPZFMatrix<std::complex<float>_> local_3878;
  TPZFront<std::complex<float>_> local_37e8;
  long local_36c0;
  filebuf local_36b8 [240];
  ios_base aiStack_35c8 [264];
  long local_34c0;
  filebuf local_34b8 [240];
  ios_base aiStack_33c8 [264];
  TPZEqnArray<std::complex<float>_> local_32c0;
  
  local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = 6;
  local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 6;
  local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
  local_3a28.fElem = (complex<float> *)0x0;
  local_3a28.fGiven = (complex<float> *)0x0;
  lVar5 = 0;
  local_3a28.fSize = 0;
  TPZVec<int>::TPZVec(&local_3a28.fPivot.super_TPZVec<int>,0);
  local_3a28.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3a28.fPivot.super_TPZVec<int>.fStore = local_3a28.fPivot.fExtAlloc;
  local_3a28.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3a28.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3a28.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  local_3a28.fWork.fStore = (complex<float> *)0x0;
  local_3a28.fWork.fNElements = 0;
  local_3a28.fWork.fNAlloc = 0;
  __s = (complex<float> *)operator_new__(0x120);
  memset(__s,0,0x120);
  lVar6 = 0;
  local_3a28.fElem = __s;
  do {
    lVar3 = 0;
    lVar4 = lVar6;
    do {
      iVar2 = rand();
      if ((local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar6) ||
         (local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol <= lVar4)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *(float *)&local_3a28.fElem
                 [local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow * lVar4
                  + lVar6]._M_value = (float)((iVar2 * 6) / 0x7fff);
      *(undefined4 *)
       ((long)&local_3a28.fElem
               [local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow * lVar4 +
                lVar6]._M_value + 4) = 0;
      if (local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol <= lVar4 ||
          local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar6) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar4) ||
         (local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *(_ComplexT *)
       ((long)&local_3a28.fElem[lVar4]._M_value +
       local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow * lVar5) =
           local_3a28.fElem
           [local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow * lVar4 +
            lVar6]._M_value;
      bVar7 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      if (bVar7) {
        if ((local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar6) ||
           (local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_3a28.fElem
        [local_3a28.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow * lVar6 + lVar6].
        _M_value = 0x45bb8000;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 8;
    if (lVar6 == 6) {
      local_3878.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = 0;
      local_3878.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 0;
      local_3878.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_3878.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_3878.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
      local_3878.fElem = (complex<float> *)0x0;
      local_3878.fGiven = (complex<float> *)0x0;
      local_3878.fSize = 0;
      TPZVec<int>::TPZVec(&local_3878.fPivot.super_TPZVec<int>,0);
      local_3878.fPivot.super_TPZVec<int>.fStore = local_3878.fPivot.fExtAlloc;
      local_3878.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_3878.fPivot.super_TPZVec<int>.fNElements = 0;
      local_3878.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_3878.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
      local_3878.fWork.fStore = (complex<float> *)0x0;
      local_3878.fWork.fNElements = 0;
      local_3878.fWork.fNAlloc = 0;
      TPZFMatrix<std::complex<float>_>::operator=(&local_3878,&local_3a28);
      TPZMatrix<std::complex<float>_>::Print
                (&local_3878.super_TPZMatrix<std::complex<float>_>,"TPZFMatrix<TVar> Cholesky",
                 (ostream *)&std::cout,EFormatted);
      TPZFront<std::complex<float>_>::TPZFront(&local_37e8,&PTR_PTR_0198f548,6);
      local_37e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFrontNonSym_0198f4d0;
      local_37e8.fDecomposeType = ELU;
      local_37e8.fWork = 0;
      TPZVec<long>::TPZVec(&local_3a48,6);
      *local_3a48.fStore = 0;
      local_3a48.fStore[1] = 1;
      local_3a48.fStore[2] = 2;
      local_3a48.fStore[3] = 3;
      local_3a48.fStore[4] = 4;
      local_3a48.fStore[5] = 5;
      SymbolicAddKel((TPZFrontNonSym<std::complex<float>_> *)&local_37e8,&local_3a48);
      lVar5 = 0;
      do {
        FreeGlobal((TPZFrontNonSym<std::complex<float>_> *)&local_37e8,lVar5);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 6);
      local_3a68 = &local_3a58;
      local_3a60 = 0;
      local_3a58 = '\0';
      std::__cxx11::string::_M_replace((ulong)&local_3a68,0,(char *)0x0,0x15736cf);
      std::ofstream::ofstream(&local_34c0,local_3a68,_S_app);
      Compress((TPZFrontNonSym<std::complex<float>_> *)&local_37e8);
      AllocData((TPZFrontNonSym<std::complex<float>_> *)&local_37e8);
      AddKel((TPZFrontNonSym<std::complex<float>_> *)&local_37e8,&local_3a28,&local_3a48);
      TPZEqnArray<std::complex<float>_>::TPZEqnArray(&local_32c0);
      DecomposeEquations((TPZFrontNonSym<std::complex<float>_> *)&local_37e8,0,5,&local_32c0);
      std::ofstream::ofstream(&local_36c0,"TestEQNArray.txt",_S_app);
      TPZEqnArray<std::complex<float>_>::Print
                (&local_32c0,"TestEQNArray.txt",(ostream *)&local_36c0);
      local_3998.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = 6;
      local_3998.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
      local_3998.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_3998.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_3998.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
      local_3998.fElem = (complex<float> *)0x0;
      local_3998.fGiven = (complex<float> *)0x0;
      local_3998.fSize = 0;
      TPZVec<int>::TPZVec(&local_3998.fPivot.super_TPZVec<int>,0);
      local_3998.fPivot.super_TPZVec<int>.fStore = local_3998.fPivot.fExtAlloc;
      local_3998.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_3998.fPivot.super_TPZVec<int>.fNElements = 0;
      local_3998.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_3998.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
      local_3998.fWork.fStore = (complex<float> *)0x0;
      local_3998.fWork.fNElements = 0;
      local_3998.fWork.fNAlloc = 0;
      local_3998.fElem = (complex<float> *)operator_new__(0x30);
      local_3998.fElem[4]._M_value = 0;
      local_3998.fElem[5]._M_value = 0;
      local_3998.fElem[2]._M_value = 0;
      local_3998.fElem[3]._M_value = 0;
      (local_3998.fElem)->_M_value = 0;
      local_3998.fElem[1]._M_value = 0;
      lVar5 = 0;
      while( true ) {
        iVar2 = rand();
        if ((local_3998.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar5) ||
           (local_3998.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol < 1)) break;
        *(float *)&local_3998.fElem[lVar5]._M_value = (float)((iVar2 * 6) / 0x7fff);
        *(undefined4 *)((long)&local_3998.fElem[lVar5]._M_value + 4) = 0;
        lVar5 = lVar5 + 1;
        if (lVar5 == 6) {
          local_3908.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = 6;
          local_3908.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
          local_3908.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_3908.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_3908.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
          local_3908.fElem = (complex<float> *)0x0;
          local_3908.fGiven = (complex<float> *)0x0;
          local_3908.fSize = 0;
          TPZVec<int>::TPZVec(&local_3908.fPivot.super_TPZVec<int>,0);
          local_3908.fPivot.super_TPZVec<int>.fStore = local_3908.fPivot.fExtAlloc;
          local_3908.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_3908.fPivot.super_TPZVec<int>.fNElements = 0;
          local_3908.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_3908.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
          local_3908.fWork.fStore = (complex<float> *)0x0;
          local_3908.fWork.fNElements = 0;
          local_3908.fWork.fNAlloc = 0;
          local_3908.fElem = (complex<float> *)operator_new__(0x30);
          local_3908.fElem[4]._M_value = 0;
          local_3908.fElem[5]._M_value = 0;
          local_3908.fElem[2]._M_value = 0;
          local_3908.fElem[3]._M_value = 0;
          (local_3908.fElem)->_M_value = 0;
          local_3908.fElem[1]._M_value = 0;
          TPZFMatrix<std::complex<float>_>::operator=(&local_3908,&local_3998);
          TPZMatrix<std::complex<float>_>::SolveDirect
                    (&local_3878.super_TPZMatrix<std::complex<float>_>,&local_3998,ECholesky);
          TPZMatrix<std::complex<float>_>::Print
                    (&local_3998.super_TPZMatrix<std::complex<float>_>,"Load",(ostream *)&std::cout,
                     EFormatted);
          TPZEqnArray<std::complex<float>_>::EqnForward(&local_32c0,&local_3908,ECholesky);
          TPZEqnArray<std::complex<float>_>::EqnBackward(&local_32c0,&local_3908,ECholesky);
          TPZMatrix<std::complex<float>_>::Print
                    (&local_3908.super_TPZMatrix<std::complex<float>_>,"Eqn",(ostream *)&std::cout,
                     EFormatted);
          TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_3908);
          TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_3998);
          uVar1 = _operator_delete__;
          lVar5 = _VTT;
          local_36c0 = _VTT;
          *(undefined8 *)(local_36b8 + *(long *)(_VTT + -0x18) + -8) = _operator_delete__;
          std::filebuf::~filebuf(local_36b8);
          std::ios_base::~ios_base(aiStack_35c8);
          TPZEqnArray<std::complex<float>_>::~TPZEqnArray(&local_32c0);
          local_34c0 = lVar5;
          *(undefined8 *)(local_34b8 + *(long *)(lVar5 + -0x18) + -8) = uVar1;
          std::filebuf::~filebuf(local_34b8);
          std::ios_base::~ios_base(aiStack_33c8);
          if (local_3a68 != &local_3a58) {
            operator_delete(local_3a68,CONCAT71(uStack_3a57,local_3a58) + 1);
          }
          local_3a48._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
          if (local_3a48.fStore != (long *)0x0) {
            operator_delete__(local_3a48.fStore);
          }
          TPZFront<std::complex<float>_>::~TPZFront(&local_37e8,&PTR_PTR_0198f548);
          TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_3878);
          TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_3a28);
          return;
        }
      }
      TPZFMatrix<std::complex<float>_>::Error
                ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
  } while( true );
}

Assistant:

void TPZFrontNonSym<TVar>::main()
{
	int i, j;
	/**
	 * 	Populates data structure
	 */
	int matsize=6;
	TPZFMatrix<TVar> TestMatrix(matsize,matsize);
	for(i=0;i<matsize;i++) {
		for(j=i;j<matsize;j++) {
			int random = rand();
			double rnd = (random*matsize)/0x7fff;
			TestMatrix(i,j)=rnd;
			TestMatrix(j,i)=TestMatrix(i,j);
			if(i==j) TestMatrix(i,j)=6000.;
		}
	}
	
	TPZFMatrix<TVar> Prova;
	Prova=TestMatrix;
	
	//	Prova.Decompose_Cholesky();
	Prova.Print("TPZFMatrix<TVar> Cholesky");
	
	TPZFrontNonSym TestFront(matsize);
	
	
	TPZVec<int64_t> DestIndex(matsize);
	for(i=0;i<matsize;i++) DestIndex[i]=i;
	
	TestFront.SymbolicAddKel(DestIndex);
	TestFront.SymbolicDecomposeEquations(0,matsize-1); 
	
	std::string OutFile;
	OutFile = "TPZFrontNonSymTest.txt";
	
	ofstream output(OutFile.c_str(),ios::app);
	
	TestFront.Compress();
	
	TestFront.AllocData();
	
	TestFront.AddKel(TestMatrix, DestIndex);
	TPZEqnArray<TVar> Result;

	TestFront.DecomposeEquations(0,matsize-1,Result);
	ofstream outeqn("TestEQNArray.txt",ios::app);
	
	Result.Print("TestEQNArray.txt",outeqn);
	
	
	TPZFMatrix<TVar> Load(matsize);
	
	for(i=0;i<matsize;i++) {
		int random = rand();
		double rnd = (random*matsize)/0x7fff;
		Load(i,0)=rnd;
	}
	
	TPZFMatrix<TVar> Load_2(matsize);
	Load_2=Load;
	
	DecomposeType decType = ECholesky;
	Prova.SolveDirect(Load, decType);
	
	Load.Print("Load");
	//TestFront.Print(OutFile, output);
	
	Result.EqnForward(Load_2, decType);
	Result.EqnBackward(Load_2, decType);
	
	Load_2.Print("Eqn");
}